

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O0

void __thiscall Security::EncodeLargeConstants(Security *this)

{
  LabelInstr *pLVar1;
  bool bVar2;
  IRKind IVar3;
  bool bVar4;
  uint uVar5;
  uint functionId;
  LabelInstr *pLVar6;
  Type *ppBVar7;
  Opnd *opnd;
  Opnd *opnd_00;
  Opnd *this_00;
  uint local_8c;
  bool local_79;
  uint local_68;
  uint uStack_64;
  bool isSrc1EqualDst;
  uint src2Size;
  uint src1Size;
  uint dstSize;
  uint currInstrConstSize;
  Opnd *dst;
  Opnd *src2;
  Opnd *src1;
  LabelInstr *label;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  uint prevInstrConstSize;
  Security *this_local;
  
  uVar5 = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,EncodeConstantsPhase,uVar5,functionId);
  if ((!bVar2) &&
     (bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), !bVar2)) {
    pLVar1 = (LabelInstr *)this->func->m_headInstr;
LAB_0084310e:
    label = pLVar1;
    if (label != (LabelInstr *)0x0) {
      pLVar1 = (LabelInstr *)(label->super_Instr).m_next;
      bVar2 = IR::Instr::IsRealInstr(&label->super_Instr);
      if (!bVar2) {
        IVar3 = IR::Instr::GetKind(&label->super_Instr);
        local_79 = true;
        if (IVar3 != InstrKindLabel) {
          local_79 = IR::Instr::IsProfiledLabelInstr(&label->super_Instr);
        }
        if (local_79 != false) {
          pLVar6 = IR::Instr::AsLabelInstr(&label->super_Instr);
          uVar5 = RealCount::Count(&(pLVar6->labelRefs).
                                    super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                    .
                                    super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                    .super_RealCount);
          if ((1 < uVar5) ||
             ((uVar5 = RealCount::Count(&(pLVar6->labelRefs).
                                         super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                         .
                                         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                         .super_RealCount), uVar5 == 1 &&
              (ppBVar7 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                                   ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                     *)&pLVar6->labelRefs),
              *ppBVar7 != (Type)(pLVar6->super_Instr).m_prev)))) {
            if (this->cookieOpnd != (IntConstOpnd *)0x0) {
              IR::Opnd::Free(&this->cookieOpnd->super_Opnd,this->func);
            }
            this->baseOpnd = (RegOpnd *)0x0;
            this->cookieOpnd = (IntConstOpnd *)0x0;
            this->basePlusCookieOpnd = (RegOpnd *)0x0;
          }
        }
        goto LAB_0084310e;
      }
      opnd = IR::Instr::GetSrc1(&label->super_Instr);
      opnd_00 = IR::Instr::GetSrc2(&label->super_Instr);
      this_00 = IR::Instr::GetDst(&label->super_Instr);
      if (((this_00 != (Opnd *)0x0) && (this->baseOpnd != (RegOpnd *)0x0)) &&
         (bVar2 = IR::Opnd::IsEqual(this_00,&this->baseOpnd->super_Opnd), bVar2)) {
        if (this->cookieOpnd != (IntConstOpnd *)0x0) {
          IR::Opnd::Free(&this->cookieOpnd->super_Opnd,this->func);
        }
        this->baseOpnd = (RegOpnd *)0x0;
        this->cookieOpnd = (IntConstOpnd *)0x0;
        this->basePlusCookieOpnd = (RegOpnd *)0x0;
      }
      if (this_00 == (Opnd *)0x0) {
        local_8c = 0;
      }
      else {
        local_8c = CalculateConstSize(this_00);
      }
      uStack_64 = 0;
      local_68 = 0;
      if ((opnd != (Opnd *)0x0) && (uStack_64 = CalculateConstSize(opnd), opnd_00 != (Opnd *)0x0)) {
        local_68 = CalculateConstSize(opnd_00);
      }
      src1Size = local_8c + uStack_64 + local_68;
      if ((src1Size < 3) &&
         (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,EncodeConstantsPhase), !bVar2))
      goto LAB_0084310e;
      bVar2 = false;
      if (1 < local_8c) {
        if (((opnd != (Opnd *)0x0) && (local_8c == uStack_64)) &&
           (bVar4 = IR::Opnd::IsEqual(opnd,this_00), bVar4)) {
          src1Size = src1Size - local_8c;
          bVar2 = true;
          if ((src1Size < 3) &&
             (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,EncodeConstantsPhase), !bVar4))
          goto LAB_0084310e;
        }
        EncodeOpnd(this,&label->super_Instr,this_00);
        if (bVar2) {
          IR::Instr::ReplaceSrc1(&label->super_Instr,this_00);
        }
        src1Size = src1Size - local_8c;
        if ((src1Size < 3) &&
           (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,EncodeConstantsPhase), !bVar4))
        goto LAB_0084310e;
      }
      if (((uStack_64 < 2) ||
          (((bVar2 || (EncodeOpnd(this,&label->super_Instr,opnd), 2 < src1Size - uStack_64)) ||
           (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,EncodeConstantsPhase), bVar2))))
         && (1 < local_68)) {
        EncodeOpnd(this,&label->super_Instr,opnd_00);
      }
      goto LAB_0084310e;
    }
  }
  return;
}

Assistant:

void
Security::EncodeLargeConstants()
{
#pragma prefast(suppress:6236 6285, "logical-or of constants is by design")
    if (PHASE_OFF(Js::EncodeConstantsPhase, this->func) || CONFIG_ISENABLED(Js::DebugFlag) || !MD_ENCODE_LG_CONSTS)
    {
        return;
    }

    uint prevInstrConstSize = 0;
    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        if (!instr->IsRealInstr())
        {
            if (instr->IsLabelInstr())
            {
                IR::LabelInstr * label = instr->AsLabelInstr();

                if (label->labelRefs.Count() > 1 || (label->labelRefs.Count() == 1 && label->labelRefs.Head() != label->m_prev))
                {
                    if (this->cookieOpnd != nullptr)
                    {
                        this->cookieOpnd->Free(this->func);
                    }
                    this->baseOpnd = nullptr;
                    this->cookieOpnd = nullptr;
                    this->basePlusCookieOpnd = nullptr;
                }
            }
            continue;
        }

        IR::Opnd *src1 = instr->GetSrc1();
        IR::Opnd *src2 = instr->GetSrc2();
        IR::Opnd *dst = instr->GetDst();

        if (dst && this->baseOpnd && dst->IsEqual(this->baseOpnd))
        {
            if (this->cookieOpnd != nullptr)
            {
                this->cookieOpnd->Free(this->func);
            }
            this->baseOpnd = nullptr;
            this->cookieOpnd = nullptr;
            this->basePlusCookieOpnd = nullptr;
        }

        uint currInstrConstSize = 0;
        uint dstSize = dst ? CalculateConstSize(dst) : 0;
        uint src1Size = 0;
        uint src2Size = 0;
        if (src1)
        {
            src1Size = CalculateConstSize(src1);
            if (src2)
            {
                src2Size = CalculateConstSize(src2);
            }
        }

        prevInstrConstSize = currInstrConstSize;
        currInstrConstSize = dstSize + src1Size + src2Size;

        // we don't need to blind constants if user controlled byte size < 3
        if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
        {
            continue;
        }

        bool isSrc1EqualDst = false;
        if (dstSize >= 2)
        {
            // don't count instrs where dst == src1 against size
            if (src1 && dstSize == src1Size && src1->IsEqual(dst))
            {
                currInstrConstSize -= dstSize;
                isSrc1EqualDst = true;

                if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
                {
                    continue;
                }
            }

            this->EncodeOpnd(instr, dst);
            if (isSrc1EqualDst)
            {
                instr->ReplaceSrc1(dst);
            }
            currInstrConstSize -= dstSize;
            if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
            {
                continue;
            }
        }
        if (src1Size >= 2 && !isSrc1EqualDst)
        {
            this->EncodeOpnd(instr, src1);
            currInstrConstSize -= src1Size;
            if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
            {
                continue;
            }
        }
        if (src2Size >= 2)
        {
            this->EncodeOpnd(instr, src2);
            currInstrConstSize -= src2Size;
        }
    } NEXT_INSTR_IN_FUNC_EDITING;

}